

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::InitScanFiles(cmQtAutoGenInitializer *this)

{
  cmMakefile *pcVar1;
  string_view suffix_00;
  bool bVar2;
  __type _Var3;
  cmake *this_00;
  Keywords *pKVar4;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  *this_01;
  Keywords *this_02;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *this_03;
  reference ppVar5;
  type pMVar6;
  const_iterator pbVar7;
  vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  *this_04;
  pointer pcVar8;
  ulong uVar9;
  pointer pMVar10;
  vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
  *pvVar11;
  reference ppMVar12;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *this_05;
  reference ppcVar13;
  string *psVar14;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *pvVar15;
  reference pQVar16;
  ConfigString *configString;
  reference pQVar17;
  element_type *peVar18;
  undefined8 uVar19;
  char *pcVar20;
  PolicyID id;
  PolicyID id_00;
  undefined1 uVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_06;
  char *pcVar23;
  static_string_view sVar24;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar25;
  undefined1 auVar26 [16];
  string_view sVar27;
  string_view text;
  string_view text_00;
  string_view sVar28;
  bool local_133a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1240;
  string local_1228;
  undefined1 local_1208 [8];
  RccLister lister;
  string error;
  Qrc *qrc_4;
  iterator __end2_6;
  iterator __begin2_6;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *__range2_6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nameOpts;
  cmAlphaNum local_1148;
  string local_1118;
  char local_10f2 [2];
  char *local_10f0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10e8;
  undefined1 local_10e0 [8];
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts_1;
  Qrc *qrc_3;
  iterator __end2_5;
  iterator __begin2_5;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *__range2_5;
  char *local_1080;
  cmAlphaNum local_1078;
  cmAlphaNum local_1048;
  string local_1018;
  string_view local_ff8;
  cmAlphaNum local_fe8;
  cmAlphaNum local_fb8;
  string local_f88;
  cmAlphaNum local_f68;
  cmAlphaNum local_f38;
  string local_f08;
  char local_ee1;
  cmAlphaNum local_ee0;
  cmAlphaNum local_eb0;
  undefined1 local_e80 [8];
  string base;
  cmAlphaNum local_e30;
  string local_e00;
  string local_de0;
  reference local_dc0;
  Qrc *qrc_2;
  iterator __end2_4;
  iterator __begin2_4;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *__range2_4;
  Qrc *qrc2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *__range3_1;
  Qrc *qrc_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *__range2_3;
  undefined1 local_d50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optionsTarget;
  undefined1 local_d30 [7];
  bool modernQt;
  cmAlphaNum local_d10;
  string local_ce0;
  cmAlphaNum local_cc0;
  string local_c90;
  char local_c69;
  undefined1 local_c68 [16];
  string local_c58;
  cmAlphaNum local_c38;
  cmAlphaNum local_c08;
  string local_bd8;
  cmSourceFile *local_bb8;
  cmSourceFile *sf_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range2_2;
  string files_1;
  size_t local_b70;
  basic_string_view<char,_std::char_traits<char>_> local_b68;
  basic_string_view<char,_std::char_traits<char>_> local_b58;
  undefined1 local_b48 [8];
  string_view property_1;
  cmAlphaNum local_b18;
  string local_ae8;
  cmAlphaNum local_ac8;
  string local_a98;
  char local_a71;
  undefined1 local_a70 [16];
  string local_a60;
  cmAlphaNum local_a40;
  cmAlphaNum local_a10;
  string local_9e0;
  MUFile *local_9c0;
  MUFile *muf_4;
  iterator __end4_1;
  iterator __begin4_1;
  vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
  *__range4_1;
  string files;
  size_t local_978;
  basic_string_view<char,_std::char_traits<char>_> local_970;
  basic_string_view<char,_std::char_traits<char>_> local_960;
  undefined1 local_950 [8];
  string_view property;
  MUFile *muf_3;
  iterator __end3;
  iterator __begin3;
  vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
  *__range3;
  pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_900;
  string_view local_888;
  string_view local_878;
  string_view local_868;
  cmAlphaNum local_850;
  cmAlphaNum local_820;
  string local_7f0;
  string_view local_7d0;
  undefined1 local_7c0 [8];
  string uiHeaderGenex;
  ConfigString uiHeader;
  string local_738;
  string_view local_718;
  cmAlphaNum local_708;
  cmAlphaNum local_6d8;
  undefined1 local_6a8 [8];
  string uiHeaderFilePath;
  undefined1 local_668 [8];
  string uiHeaderRelativePath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_638;
  string local_620 [8];
  string uicOpts;
  undefined1 auStack_5f8 [6];
  bool skipUic;
  bool skipAutogen;
  pointer puStack_5f0;
  pointer local_5e8;
  MUFileHandle muf_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  MUFileHandle muf_1;
  string local_568;
  string *local_548;
  string *extLower_1;
  string *fullPath_2;
  string pathError;
  unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *sf_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  *__range2_1;
  MUFileHandle eMuf;
  cmSourceFile *local_4d8;
  cmSourceFile *sf;
  undefined1 local_4c8 [4];
  cmSourceFileLocationKind locationKind;
  cmAlphaNum local_498;
  undefined1 local_468 [8];
  string fullPath_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  const_iterator __end5;
  const_iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  cmAlphaNum local_418;
  cmAlphaNum local_3e8;
  undefined1 local_3b8 [8];
  string suffixedPath;
  basic_string_view<char,_std::char_traits<char>_> *suffix;
  const_iterator __end4;
  const_iterator __begin4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range4;
  cmAlphaNum local_358;
  undefined1 local_328 [16];
  string local_318;
  cmAlphaNum local_2f8;
  undefined1 local_2c8 [8];
  string basePath;
  string *srcFullPath;
  MUFile *muf;
  pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>
  *pair;
  iterator __end2;
  iterator __begin2;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *exts;
  string *opts;
  undefined1 local_238 [8];
  Qrc qrc;
  undefined1 local_c0 [16];
  char *local_b0;
  string local_98;
  string *local_78;
  string *extLower;
  string *fullPath;
  AllConfigSource *acs;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  *__range1;
  anon_class_8_1_8991fb9c addMUSource;
  anon_class_8_1_8991fb9c addMUHeader;
  anon_class_16_2_e88080e7 makeMUFile;
  Keywords *kw;
  cmake *cm;
  cmQtAutoGenInitializer *this_local;
  
  this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
  pKVar4 = cmQtAutoGenGlobalInitializer::kw(this->GlobalInitializer);
  uVar19 = pKVar4;
  __range1 = (vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
              *)this;
  addMUSource.this = this;
  addMUHeader.this = this;
  this_01 = cmGeneratorTarget::GetAllConfigSources(this->GenTarget);
  __end1 = std::
           vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
           ::begin(this_01);
  acs = (AllConfigSource *)
        std::
        vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
        ::end(this_01);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmGeneratorTarget::AllConfigSource_*,_std::vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>_>
                                *)&acs);
    if (!bVar2) break;
    fullPath = (string *)
               __gnu_cxx::
               __normal_iterator<const_cmGeneratorTarget::AllConfigSource_*,_std::vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>_>
               ::operator*(&__end1);
    extLower = cmSourceFile::GetFullPath_abi_cxx11_(((reference)fullPath)->Source);
    psVar14 = cmSourceFile::GetExtension_abi_cxx11_(*(cmSourceFile **)fullPath);
    cmsys::SystemTools::LowerCase(&local_98,psVar14);
    local_78 = &local_98;
    bVar2 = MocOrUicEnabled(this);
    if (bVar2) {
      sVar27 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
      unique0x10005ac2 = sVar27;
      bVar2 = cmake::IsAHeaderExtension(this_00,sVar27);
      if (bVar2) {
        in_R8 = &fullPath->field_2;
        InitScanFiles::anon_class_16_2_e88080e7::operator()
                  ((anon_class_16_2_e88080e7 *)local_c0,(cmSourceFile *)&addMUHeader,
                   *(string **)fullPath,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)extLower,SUB81(in_R8,0))
        ;
        sVar27 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
        uVar19 = sVar27._M_str;
        InitScanFiles::anon_class_8_1_8991fb9c::operator()
                  (&addMUSource,(MUFileHandle *)local_c0,sVar27);
        std::
        unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                       *)local_c0);
      }
      else {
        sVar27 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
        bVar2 = cmake::IsACLikeSourceExtension(this_00,sVar27);
        if (bVar2) {
          in_R8 = &fullPath->field_2;
          uVar19 = extLower;
          InitScanFiles::anon_class_16_2_e88080e7::operator()
                    ((anon_class_16_2_e88080e7 *)
                     &qrc.Resources.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (cmSourceFile *)&addMUHeader,*(string **)fullPath,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)extLower,
                     SUB81(in_R8,0));
          InitScanFiles::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)&__range1,
                     (MUFileHandle *)
                     &qrc.Resources.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                         *)&qrc.Resources.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
    }
    if (((this->Rcc).super_GenVarsT.Enabled & 1U) != 0) {
      _Var3 = std::operator==(local_78,&pKVar4->qrc);
      if (_Var3) {
        bVar2 = cmSourceFile::GetPropertyAsBool(*(cmSourceFile **)fullPath,&pKVar4->SKIP_AUTOGEN);
        if (!bVar2) {
          bVar2 = cmSourceFile::GetPropertyAsBool(*(cmSourceFile **)fullPath,&pKVar4->SKIP_AUTORCC);
          if (!bVar2) {
            Qrc::Qrc((Qrc *)local_238);
            std::__cxx11::string::operator=
                      ((string *)(qrc.LockFile.field_2._M_local_buf + 8),(string *)extLower);
            cmsys::SystemTools::GetFilenameWithoutLastExtension
                      ((string *)&opts,(string *)((long)&qrc.LockFile.field_2 + 8));
            std::__cxx11::string::operator=
                      ((string *)(qrc.QrcFile.field_2._M_local_buf + 8),(string *)&opts);
            std::__cxx11::string::~string((string *)&opts);
            qrc.OutputFile.field_2._M_local_buf[8] =
                 cmSourceFile::GetIsGenerated(*(cmSourceFile **)fullPath,GlobalAndLocal);
            psVar14 = cmSourceFile::GetSafeProperty
                                (*(cmSourceFile **)fullPath,&pKVar4->AUTORCC_OPTIONS);
            uVar9 = std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              sVar27 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar14);
              uVar19 = (Keywords *)0x0;
              cmExpandList(sVar27,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&qrc.Generated,false);
            }
            std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
            push_back(&(this->Rcc).Qrcs,(value_type *)local_238);
            Qrc::~Qrc((Qrc *)local_238);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_98);
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorTarget::AllConfigSource_*,_std::vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>_>
    ::operator++(&__end1);
  }
  cmGeneratorTarget::ClearSourcesCache(this->GenTarget);
  bVar2 = MocOrUicEnabled(this);
  if (bVar2) {
    this_02 = (Keywords *)cmake::GetHeaderExtensions_abi_cxx11_(this_00);
    this_03 = &(this->AutogenTarget).Sources;
    uVar19 = this_02;
    __end2 = std::
             unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
             ::begin(this_03);
    pair = (pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>
            *)std::
              unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
              ::end(this_03);
    while( true ) {
      bVar2 = std::__detail::operator!=
                        (&__end2.
                          super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                         ,(_Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                           *)&pair);
      if (!bVar2) break;
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>
               ::operator*(&__end2);
      pMVar6 = std::
               unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
               ::operator*(&ppVar5->second);
      if (((pMVar6->MocIt & 1U) != 0) || ((pMVar6->UicIt & 1U) != 0)) {
        basePath.field_2._8_8_ =
             cmSourceFile::ResolveFullPath(pMVar6->SF,(string *)0x0,(string *)0x0);
        auVar26 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)basePath.field_2._8_8_);
        sVar27._M_len = auVar26._8_8_;
        sVar27._M_str = (char *)uVar19;
        local_328 = auVar26;
        cmQtAutoGen::SubDirPrefix_abi_cxx11_(&local_318,auVar26._0_8_,sVar27);
        cmAlphaNum::cmAlphaNum(&local_2f8,&local_318);
        cmsys::SystemTools::GetFilenameWithoutLastExtension
                  ((string *)&__range4,(string *)basePath.field_2._8_8_);
        cmAlphaNum::cmAlphaNum(&local_358,(string *)&__range4);
        cmStrCat<>((string *)local_2c8,&local_2f8,&local_358);
        std::__cxx11::string::~string((string *)&__range4);
        std::__cxx11::string::~string((string *)&local_318);
        __end4 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::
                 begin(&InitScanFiles::suffixes);
        pbVar7 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                           (&InitScanFiles::suffixes);
        for (; __end4 != pbVar7; __end4 = __end4 + 1) {
          suffixedPath.field_2._8_8_ = __end4;
          cmAlphaNum::cmAlphaNum(&local_3e8,(string *)local_2c8);
          cmAlphaNum::cmAlphaNum(&local_418,*(string_view *)suffixedPath.field_2._8_8_);
          cmStrCat<>((string *)local_3b8,&local_3e8,&local_418);
          __end5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)this_02);
          ext = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_02);
          while( true ) {
            bVar2 = __gnu_cxx::operator!=
                              (&__end5,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&ext);
            if (!bVar2) break;
            fullPath_1.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end5);
            cmAlphaNum::cmAlphaNum(&local_498,(string *)local_3b8);
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_4c8,'.');
            uVar19 = fullPath_1.field_2._8_8_;
            cmStrCat<std::__cxx11::string>
                      ((string *)local_468,&local_498,(cmAlphaNum *)local_4c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       fullPath_1.field_2._8_8_);
            sf._4_4_ = 1;
            local_4d8 = cmMakefile::GetSource(this->Makefile,(string *)local_468,Known);
            if (local_4d8 == (cmSourceFile *)0x0) {
              bVar2 = cmsys::SystemTools::FileExists((string *)local_468);
              if (bVar2) {
                uVar19 = (Keywords *)0x1;
                local_4d8 = cmMakefile::CreateSource(this->Makefile,(string *)local_468,false,Known)
                ;
              }
LAB_0081e405:
              if (local_4d8 != (cmSourceFile *)0x0) {
                in_R8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                         *)&pMVar6->Configs;
                InitScanFiles::anon_class_16_2_e88080e7::operator()
                          ((anon_class_16_2_e88080e7 *)&stack0xfffffffffffffb18,
                           (cmSourceFile *)&addMUHeader,(string *)local_4d8,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_468,
                           SUB81(in_R8,0));
                if ((pMVar6->MocIt & 1U) == 0) {
                  pMVar10 = std::
                            unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                            ::operator->((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                          *)&stack0xfffffffffffffb18);
                  pMVar10->MocIt = false;
                }
                if ((pMVar6->UicIt & 1U) == 0) {
                  pMVar10 = std::
                            unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                            ::operator->((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                          *)&stack0xfffffffffffffb18);
                  pMVar10->UicIt = false;
                }
                sVar27 = (string_view)
                         std::__cxx11::string::operator_cast_to_basic_string_view
                                   ((string *)fullPath_1.field_2._8_8_);
                uVar19 = sVar27._M_str;
                InitScanFiles::anon_class_8_1_8991fb9c::operator()
                          (&addMUSource,(MUFileHandle *)&stack0xfffffffffffffb18,sVar27);
                std::
                unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                               *)&stack0xfffffffffffffb18);
              }
              eMuf._M_t.
              super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl._4_4_ = 0
              ;
            }
            else {
              bVar2 = ::cm::
                      contains<std::unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>,_cmSourceFile_*,_0>
                                (&(this->AutogenTarget).Headers,&local_4d8);
              if (!bVar2) {
                bVar2 = cmSourceFile::GetIsGenerated(local_4d8,GlobalAndLocal);
                if (!bVar2) {
                  bVar2 = cmsys::SystemTools::FileExists((string *)local_468);
                  if (!bVar2) {
                    eMuf._M_t.
                    super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                    .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl.
                    _4_4_ = 9;
                    goto LAB_0081e4f0;
                  }
                }
                goto LAB_0081e405;
              }
              eMuf._M_t.
              super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl._4_4_ = 9
              ;
            }
LAB_0081e4f0:
            std::__cxx11::string::~string((string *)local_468);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end5);
          }
          std::__cxx11::string::~string((string *)local_3b8);
        }
        std::__cxx11::string::~string((string *)local_2c8);
      }
      std::__detail::
      _Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>
      ::operator++(&__end2);
    }
  }
  bVar2 = MocOrUicEnabled(this);
  sVar28._M_str = (char *)in_R8;
  sVar28._M_len = uVar19;
  if (bVar2) {
    this_04 = cmMakefile::GetSourceFiles(this->Makefile);
    __end2_1 = std::
               vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
               ::begin(this_04);
    sf_1 = (unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
           std::
           vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
           ::end(this_04);
    sVar28._M_str = (char *)in_R8;
    sVar28._M_len = uVar19;
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<const_std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_*,_std::vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>_>
                          *)&sf_1);
      if (!bVar2) break;
      pathError.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_*,_std::vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>_>
           ::operator*(&__end2_1);
      std::__cxx11::string::string((string *)&fullPath_2);
      pcVar8 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::operator->
                         ((unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
                          pathError.field_2._8_8_);
      extLower_1 = cmSourceFile::ResolveFullPath(pcVar8,(string *)&fullPath_2,(string *)0x0);
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
LAB_0081e67e:
        eMuf._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl._4_4_ = 0xb;
      }
      else {
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) != 0) goto LAB_0081e67e;
        pcVar8 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::operator->
                           ((unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
                            pathError.field_2._8_8_);
        psVar14 = cmSourceFile::GetExtension_abi_cxx11_(pcVar8);
        cmsys::SystemTools::LowerCase(&local_568,psVar14);
        local_548 = &local_568;
        sVar27 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_548);
        bVar2 = cmake::IsAHeaderExtension(this_00,sVar27);
        if (bVar2) {
          muf_1._M_t.
          super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
               (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
                )std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::get
                           ((unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
                            pathError.field_2._8_8_);
          bVar2 = ::cm::
                  contains<std::unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>,_cmSourceFile_*,_0>
                            (&(this->AutogenTarget).Headers,(cmSourceFile **)&muf_1);
          if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_0081f106;
          pcVar8 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::get
                             ((unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
                              pathError.field_2._8_8_);
          psVar14 = extLower_1;
          local_5a8._M_dataplus = (_Alloc_hider)0x0;
          local_5a8._1_7_ = 0;
          local_5a8._M_string_length = 0;
          local_5a8.field_2._M_allocated_capacity = 0;
          pbVar22 = &local_5a8;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pbVar22);
          InitScanFiles::anon_class_16_2_e88080e7::operator()
                    ((anon_class_16_2_e88080e7 *)&stack0xfffffffffffffa78,
                     (cmSourceFile *)&addMUHeader,(string *)pcVar8,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)psVar14,
                     SUB81(pbVar22,0));
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_5a8);
          pMVar10 = std::
                    unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                    ::operator->((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                  *)&stack0xfffffffffffffa78);
          if ((pMVar10->SkipMoc & 1U) == 0) {
            pMVar10 = std::
                      unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                      ::operator->((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                    *)&stack0xfffffffffffffa78);
            if ((pMVar10->SkipUic & 1U) != 0) goto LAB_0081e834;
          }
          else {
LAB_0081e834:
            sVar27 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_548);
            psVar14 = (string *)sVar27._M_str;
            InitScanFiles::anon_class_8_1_8991fb9c::operator()
                      (&addMUSource,(MUFileHandle *)&stack0xfffffffffffffa78,sVar27);
          }
          std::
          unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                         *)&stack0xfffffffffffffa78);
          sVar28._M_str = (char *)pbVar22;
          sVar28._M_len = (size_t)psVar14;
        }
        else {
          sVar27 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_548);
          bVar2 = cmake::IsACLikeSourceExtension(this_00,sVar27);
          if (bVar2) {
            muf_2._M_t.
            super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
            .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
                 (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
                  )std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::get
                             ((unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
                              pathError.field_2._8_8_);
            bVar2 = ::cm::
                    contains<std::unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>,_cmSourceFile_*,_0>
                              (&(this->AutogenTarget).Sources,(cmSourceFile **)&muf_2);
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              pcVar8 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::get
                                 ((unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
                                  pathError.field_2._8_8_);
              psVar14 = extLower_1;
              _auStack_5f8 = (pointer)0x0;
              puStack_5f0 = (pointer)0x0;
              local_5e8 = (pointer)0x0;
              this_06 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_5f8;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(this_06);
              InitScanFiles::anon_class_16_2_e88080e7::operator()
                        ((anon_class_16_2_e88080e7 *)&stack0xfffffffffffffa28,
                         (cmSourceFile *)&addMUHeader,(string *)pcVar8,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)psVar14,
                         SUB81(this_06,0));
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_5f8);
              pMVar10 = std::
                        unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                        ::operator->((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                      *)&stack0xfffffffffffffa28);
              if ((pMVar10->SkipMoc & 1U) == 0) {
                pMVar10 = std::
                          unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          ::operator->((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                        *)&stack0xfffffffffffffa28);
                if ((pMVar10->SkipUic & 1U) != 0) goto LAB_0081ea2a;
              }
              else {
LAB_0081ea2a:
                InitScanFiles::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)&__range1,
                           (MUFileHandle *)&stack0xfffffffffffffa28);
              }
              std::
              unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                             *)&stack0xfffffffffffffa28);
              sVar28._M_str = (char *)this_06;
              sVar28._M_len = (size_t)psVar14;
            }
          }
          else if (((this->Uic).super_GenVarsT.Enabled & 1U) != 0) {
            _Var3 = std::operator==(local_548,&pKVar4->ui);
            pcVar20 = sVar28._M_str;
            if (_Var3) {
              pcVar8 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::operator->
                                 ((unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
                                  pathError.field_2._8_8_);
              uicOpts.field_2._M_local_buf[0xf] =
                   cmSourceFile::GetPropertyAsBool(pcVar8,&pKVar4->SKIP_AUTOGEN);
              local_133a = true;
              if (!(bool)uicOpts.field_2._M_local_buf[0xf]) {
                pcVar8 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::
                         operator->((unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
                                    pathError.field_2._8_8_);
                local_133a = cmSourceFile::GetPropertyAsBool(pcVar8,&pKVar4->SKIP_AUTOUIC);
              }
              uicOpts.field_2._M_local_buf[0xe] = local_133a;
              if (local_133a == false) {
                pcVar8 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::
                         operator->((unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
                                    pathError.field_2._8_8_);
                psVar14 = cmSourceFile::GetSafeProperty(pcVar8,&pKVar4->AUTOUIC_OPTIONS);
                std::__cxx11::string::string(local_620,(string *)psVar14);
                uVar9 = std::__cxx11::string::empty();
                psVar14 = extLower_1;
                if ((uVar9 & 1) == 0) {
                  sVar27 = (string_view)
                           std::__cxx11::string::operator_cast_to_basic_string_view(local_620);
                  uiHeaderRelativePath.field_2._8_8_ = sVar27._M_len;
                  cmExpandedList_abi_cxx11_(&local_638,sVar27,false);
                  std::
                  vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  ::
                  emplace_back<std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            ((vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                              *)&(this->Uic).UiFilesWithOptions,psVar14,&local_638);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_638);
                }
                else {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string_const&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &(this->Uic).UiFilesNoOptions,extLower_1);
                }
                psVar14 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(this->LocalGen);
                cmsys::SystemTools::GetFilenamePath
                          ((string *)((long)&uiHeaderFilePath.field_2 + 8),extLower_1);
                cmSystemTools::RelativePath
                          ((string *)local_668,psVar14,
                           (string *)((long)&uiHeaderFilePath.field_2 + 8));
                std::__cxx11::string::~string((string *)(uiHeaderFilePath.field_2._M_local_buf + 8))
                ;
                uVar9 = std::__cxx11::string::empty();
                if ((uVar9 & 1) == 0) {
                  pcVar20 = (char *)std::__cxx11::string::back();
                  if (*pcVar20 != '/') {
                    std::__cxx11::string::operator+=((string *)local_668,'/');
                  }
                }
                cmAlphaNum::cmAlphaNum(&local_6d8,'/');
                cmAlphaNum::cmAlphaNum(&local_708,(string *)local_668);
                sVar27 = (string_view)::cm::operator____s("ui_",3);
                local_718 = sVar27;
                cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_738,extLower_1);
                sVar24 = ::cm::operator____s(".h",2);
                uiHeader.Config._M_h._M_single_bucket =
                     (__node_base_ptr)sVar24.super_string_view._M_len;
                cmStrCat<cm::static_string_view,std::__cxx11::string,cm::static_string_view>
                          ((string *)local_6a8,&local_6d8,&local_708,
                           (static_string_view *)&local_718,&local_738,
                           (static_string_view *)&uiHeader.Config._M_h._M_single_bucket);
                std::__cxx11::string::~string((string *)&local_738);
                ConfigString::ConfigString((ConfigString *)((long)&uiHeaderGenex.field_2 + 8));
                std::__cxx11::string::string((string *)local_7c0);
                cmAlphaNum::cmAlphaNum(&local_820,&(this->Dir).Build);
                sVar27 = (string_view)::cm::operator____s("/include",8);
                local_878 = sVar27;
                local_868 = sVar27;
                cmAlphaNum::cmAlphaNum(&local_850,sVar27);
                cmStrCat<>(&local_7f0,&local_820,&local_850);
                sVar27 = (string_view)
                         std::__cxx11::string::operator_cast_to_basic_string_view
                                   ((string *)&local_7f0);
                local_7d0 = sVar27;
                sVar27 = (string_view)
                         std::__cxx11::string::operator_cast_to_basic_string_view
                                   ((string *)local_6a8);
                local_888 = sVar27;
                sVar28 = local_7d0;
                ConfigFileNamesAndGenex
                          (this,(ConfigString *)((long)&uiHeaderGenex.field_2 + 8),
                           (string *)local_7c0,local_7d0,sVar27);
                std::__cxx11::string::~string((string *)&local_7f0);
                std::make_pair<cmQtAutoGenInitializer::ConfigString&,std::__cxx11::string&>
                          (&local_900,(ConfigString *)((long)&uiHeaderGenex.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_7c0);
                std::
                vector<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>,std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>>>
                ::emplace_back<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>>
                          ((vector<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>,std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>>>
                            *)&(this->Uic).UiHeaders,&local_900);
                std::
                pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair(&local_900);
                std::__cxx11::string::~string((string *)local_7c0);
                ConfigString::~ConfigString((ConfigString *)((long)&uiHeaderGenex.field_2 + 8));
                std::__cxx11::string::~string((string *)local_6a8);
                std::__cxx11::string::~string((string *)local_668);
                std::__cxx11::string::~string(local_620);
              }
              else {
                pVar25 = std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::insert(&(this->Uic).SkipUi,extLower_1);
                sVar28._M_str = pcVar20;
                sVar28._M_len = (size_t)pVar25.first._M_node._M_node;
              }
            }
          }
        }
LAB_0081f106:
        std::__cxx11::string::~string((string *)&local_568);
        eMuf._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl._4_4_ = 0;
      }
      std::__cxx11::string::~string((string *)&fullPath_2);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_*,_std::vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>_>
      ::operator++(&__end2_1);
    }
  }
  bVar2 = MocOrUicEnabled(this);
  if (bVar2) {
    bVar2 = std::
            vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
            ::empty(&(this->AutogenTarget).FilesGenerated);
    auVar26._8_8_ = local_a70._8_8_;
    auVar26._0_8_ = local_a70._0_8_;
    if (!bVar2) {
      if ((this->CMP0071Accept & 1U) == 0) {
        local_a70 = auVar26;
        if ((this->CMP0071Warn & 1U) != 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_950);
          if ((((this->Moc).super_GenVarsT.Enabled & 1U) == 0) ||
             (((this->Uic).super_GenVarsT.Enabled & 1U) == 0)) {
            if (((this->Moc).super_GenVarsT.Enabled & 1U) == 0) {
              if (((this->Uic).super_GenVarsT.Enabled & 1U) != 0) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           ((long)&files.field_2 + 8),"SKIP_AUTOUIC");
                local_950 = (undefined1  [8])files.field_2._8_8_;
                property._M_len = local_978;
              }
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_970,"SKIP_AUTOMOC");
              local_950 = (undefined1  [8])local_970._M_len;
              property._M_len = (size_t)local_970._M_str;
            }
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_960,"SKIP_AUTOGEN");
            local_950 = (undefined1  [8])local_960._M_len;
            property._M_len = (size_t)local_960._M_str;
          }
          std::__cxx11::string::string((string *)&__range4_1);
          pvVar11 = &(this->AutogenTarget).FilesGenerated;
          __end4_1 = std::
                     vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                     ::begin(pvVar11);
          muf_4 = (MUFile *)
                  std::
                  vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                  ::end(pvVar11);
          while( true ) {
            bVar2 = __gnu_cxx::operator!=
                              (&__end4_1,
                               (__normal_iterator<cmQtAutoGenInitializer::MUFile_**,_std::vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>_>
                                *)&muf_4);
            uVar21 = sVar28._M_str._0_1_;
            if (!bVar2) break;
            ppMVar12 = __gnu_cxx::
                       __normal_iterator<cmQtAutoGenInitializer::MUFile_**,_std::vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>_>
                       ::operator*(&__end4_1);
            local_9c0 = *ppMVar12;
            cmAlphaNum::cmAlphaNum(&local_a10,"  ");
            auVar26 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_9c0);
            pcVar23 = sVar28._M_str;
            text._M_str = (char *)sVar28._M_len;
            text._M_len = auVar26._8_8_;
            local_a70 = auVar26;
            cmQtAutoGen::Quoted_abi_cxx11_(&local_a60,auVar26._0_8_,text);
            cmAlphaNum::cmAlphaNum(&local_a40,&local_a60);
            local_a71 = '\n';
            pcVar20 = &local_a71;
            cmStrCat<char>(&local_9e0,&local_a10,&local_a40,pcVar20);
            std::__cxx11::string::operator+=((string *)&__range4_1,(string *)&local_9e0);
            std::__cxx11::string::~string((string *)&local_9e0);
            std::__cxx11::string::~string((string *)&local_a60);
            __gnu_cxx::
            __normal_iterator<cmQtAutoGenInitializer::MUFile_**,_std::vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>_>
            ::operator++(&__end4_1);
            sVar28._M_str = pcVar23;
            sVar28._M_len = (size_t)pcVar20;
          }
          pcVar1 = this->Makefile;
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_ae8,(cmPolicies *)0x47,id);
          cmAlphaNum::cmAlphaNum(&local_ac8,&local_ae8);
          cmAlphaNum::cmAlphaNum(&local_b18,'\n');
          cmQtAutoGen::Tools_abi_cxx11_
                    ((string *)&property_1._M_str,
                     (cmQtAutoGen *)(ulong)((this->Moc).super_GenVarsT.Enabled & 1),
                     (bool)((this->Uic).super_GenVarsT.Enabled & 1),false,(bool)uVar21);
          pcVar20 = "For compatibility, CMake is excluding the GENERATED source file(s):\n";
          pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range4_1
          ;
          cmStrCat<char[69],std::__cxx11::string,char[20],std::__cxx11::string,char[171],std::basic_string_view<char,std::char_traits<char>>,char[41],std::basic_string_view<char,std::char_traits<char>>,char[6]>
                    (&local_a98,&local_ac8,&local_b18,
                     (char (*) [69])
                     "For compatibility, CMake is excluding the GENERATED source file(s):\n",pbVar22
                     ,(char (*) [20])"from processing by ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &property_1._M_str,
                     (char (*) [171])
                     ".  If any of the files should be processed, set CMP0071 to NEW.  If any of the files should not be processed, explicitly exclude them by setting the source file property "
                     ,(basic_string_view<char,_std::char_traits<char>_> *)local_950,
                     (char (*) [41])":\n  set_property(SOURCE file.h PROPERTY ",
                     (basic_string_view<char,_std::char_traits<char>_> *)local_950,
                     (char (*) [6])" ON)\n");
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_a98);
          std::__cxx11::string::~string((string *)&local_a98);
          std::__cxx11::string::~string((string *)&property_1._M_str);
          std::__cxx11::string::~string((string *)&local_ae8);
          std::__cxx11::string::~string((string *)&__range4_1);
          sVar28._M_str = (char *)pbVar22;
          sVar28._M_len = (size_t)pcVar20;
        }
      }
      else {
        pvVar11 = &(this->AutogenTarget).FilesGenerated;
        __end3 = std::
                 vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                 ::begin(pvVar11);
        muf_3 = (MUFile *)
                std::
                vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                ::end(pvVar11);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<cmQtAutoGenInitializer::MUFile_**,_std::vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>_>
                                      *)&muf_3);
          if (!bVar2) break;
          ppMVar12 = __gnu_cxx::
                     __normal_iterator<cmQtAutoGenInitializer::MUFile_**,_std::vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>_>
                     ::operator*(&__end3);
          pVar25 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert(&(this->AutogenTarget).DependFiles,&(*ppMVar12)->FullPath);
          property._M_str = (char *)pVar25.first._M_node;
          __gnu_cxx::
          __normal_iterator<cmQtAutoGenInitializer::MUFile_**,_std::vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>_>
          ::operator++(&__end3);
        }
      }
    }
  }
  bVar2 = MocOrUicEnabled(this);
  if (bVar2) {
    bVar2 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::empty
                      (&(this->AutogenTarget).CMP0100HeadersWarn);
    if (!bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_b48);
      if ((((this->Moc).super_GenVarsT.Enabled & 1U) == 0) ||
         (((this->Uic).super_GenVarsT.Enabled & 1U) == 0)) {
        if (((this->Moc).super_GenVarsT.Enabled & 1U) == 0) {
          if (((this->Uic).super_GenVarsT.Enabled & 1U) != 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       ((long)&files_1.field_2 + 8),"SKIP_AUTOUIC");
            local_b48 = (undefined1  [8])files_1.field_2._8_8_;
            property_1._M_len = local_b70;
          }
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_b68,"SKIP_AUTOMOC");
          local_b48 = (undefined1  [8])local_b68._M_len;
          property_1._M_len = (size_t)local_b68._M_str;
        }
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_b58,"SKIP_AUTOGEN");
        local_b48 = (undefined1  [8])local_b58._M_len;
        property_1._M_len = (size_t)local_b58._M_str;
      }
      std::__cxx11::string::string((string *)&__range2_2);
      this_05 = &(this->AutogenTarget).CMP0100HeadersWarn;
      __end2_2 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin(this_05);
      sf_2 = (cmSourceFile *)
             std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end(this_05);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end2_2,
                           (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                            *)&sf_2);
        uVar21 = sVar28._M_str._0_1_;
        if (!bVar2) break;
        ppcVar13 = __gnu_cxx::
                   __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                   ::operator*(&__end2_2);
        local_bb8 = *ppcVar13;
        cmAlphaNum::cmAlphaNum(&local_c08,"  ");
        psVar14 = cmSourceFile::GetFullPath_abi_cxx11_(local_bb8);
        auVar26 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar14);
        pcVar23 = sVar28._M_str;
        text_00._M_str = (char *)sVar28._M_len;
        text_00._M_len = auVar26._8_8_;
        local_c68 = auVar26;
        cmQtAutoGen::Quoted_abi_cxx11_(&local_c58,auVar26._0_8_,text_00);
        cmAlphaNum::cmAlphaNum(&local_c38,&local_c58);
        local_c69 = '\n';
        pcVar20 = &local_c69;
        cmStrCat<char>(&local_bd8,&local_c08,&local_c38,pcVar20);
        std::__cxx11::string::operator+=((string *)&__range2_2,(string *)&local_bd8);
        std::__cxx11::string::~string((string *)&local_bd8);
        std::__cxx11::string::~string((string *)&local_c58);
        __gnu_cxx::
        __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&__end2_2);
        sVar28._M_str = pcVar23;
        sVar28._M_len = (size_t)pcVar20;
      }
      pcVar1 = this->Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_ce0,(cmPolicies *)0x64,id_00);
      cmAlphaNum::cmAlphaNum(&local_cc0,&local_ce0);
      cmAlphaNum::cmAlphaNum(&local_d10,'\n');
      cmQtAutoGen::Tools_abi_cxx11_
                ((string *)local_d30,(cmQtAutoGen *)(ulong)((this->Moc).super_GenVarsT.Enabled & 1),
                 (bool)((this->Uic).super_GenVarsT.Enabled & 1),false,(bool)uVar21);
      cmStrCat<char[59],std::__cxx11::string,char[20],std::__cxx11::string,char[171],std::basic_string_view<char,std::char_traits<char>>,char[42],std::basic_string_view<char,std::char_traits<char>>,char[6]>
                (&local_c90,&local_cc0,&local_d10,
                 (char (*) [59])"For compatibility, CMake is excluding the header file(s):\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2_2,
                 (char (*) [20])"from processing by ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d30,
                 (char (*) [171])
                 ".  If any of the files should be processed, set CMP0100 to NEW.  If any of the files should not be processed, explicitly exclude them by setting the source file property "
                 ,(basic_string_view<char,_std::char_traits<char>_> *)local_b48,
                 (char (*) [42])":\n  set_property(SOURCE file.hh PROPERTY ",
                 (basic_string_view<char,_std::char_traits<char>_> *)local_b48,
                 (char (*) [6])" ON)\n");
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_c90);
      std::__cxx11::string::~string((string *)&local_c90);
      std::__cxx11::string::~string((string *)local_d30);
      std::__cxx11::string::~string((string *)&local_ce0);
      std::__cxx11::string::~string((string *)&__range2_2);
    }
  }
  bVar2 = std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
          empty(&(this->Rcc).Qrcs);
  if (!bVar2) {
    optionsTarget.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 4 < (this->QtVersion).Major;
    psVar14 = cmGeneratorTarget::GetSafeProperty(this->GenTarget,&pKVar4->AUTORCC_OPTIONS);
    sVar27 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar14);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d50,sVar27,false);
    pvVar15 = &(this->Rcc).Qrcs;
    __end2_3 = std::
               vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
               begin(pvVar15);
    qrc_1 = (Qrc *)std::
                   vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ::end(pvVar15);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_3,
                         (__normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                          *)&qrc_1);
      if (!bVar2) break;
      pQVar17 = __gnu_cxx::
                __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                ::operator*(&__end2_3);
      pQVar17->Unique = true;
      pvVar15 = &(this->Rcc).Qrcs;
      __end3_1 = std::
                 vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
                 begin(pvVar15);
      qrc2 = (Qrc *)std::
                    vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                    ::end(pvVar15);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end3_1,
                           (__normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                            *)&qrc2);
        if (!bVar2) break;
        pQVar16 = __gnu_cxx::
                  __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                  ::operator*(&__end3_1);
        if (pQVar17 != pQVar16) {
          _Var3 = std::operator==(&pQVar17->QrcName,&pQVar16->QrcName);
          if (_Var3) {
            pQVar17->Unique = false;
            break;
          }
        }
        __gnu_cxx::
        __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
        ::operator++(&__end3_1);
      }
      __gnu_cxx::
      __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
      ::operator++(&__end2_3);
    }
    pvVar15 = &(this->Rcc).Qrcs;
    __end2_4 = std::
               vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
               begin(pvVar15);
    qrc_2 = (Qrc *)std::
                   vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ::end(pvVar15);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_4,
                         (__normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                          *)&qrc_2);
      if (!bVar2) break;
      local_dc0 = __gnu_cxx::
                  __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                  ::operator*(&__end2_4);
      cmFilePathChecksum::getPart(&local_de0,&this->PathCheckSum,&local_dc0->QrcFile,10);
      std::__cxx11::string::operator=((string *)&local_dc0->QrcPathChecksum,(string *)&local_de0);
      std::__cxx11::string::~string((string *)&local_de0);
      cmAlphaNum::cmAlphaNum(&local_e30,&(this->Dir).Build);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&base.field_2 + 8),'/');
      cmStrCat<std::__cxx11::string,char[6],std::__cxx11::string,char[5]>
                (&local_e00,&local_e30,(cmAlphaNum *)((long)&base.field_2 + 8),
                 &local_dc0->QrcPathChecksum,(char (*) [6])"/qrc_",&local_dc0->QrcName,
                 (char (*) [5])0xe280ca);
      std::__cxx11::string::operator=((string *)&local_dc0->OutputFile,(string *)&local_e00);
      std::__cxx11::string::~string((string *)&local_e00);
      cmAlphaNum::cmAlphaNum(&local_eb0,&(this->Dir).Info);
      cmAlphaNum::cmAlphaNum(&local_ee0,"/AutoRcc_");
      local_ee1 = '_';
      cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
                ((string *)local_e80,&local_eb0,&local_ee0,&local_dc0->QrcName,&local_ee1,
                 &local_dc0->QrcPathChecksum);
      cmAlphaNum::cmAlphaNum(&local_f38,(string *)local_e80);
      cmAlphaNum::cmAlphaNum(&local_f68,"_Lock.lock");
      cmStrCat<>(&local_f08,&local_f38,&local_f68);
      std::__cxx11::string::operator=((string *)local_dc0,(string *)&local_f08);
      std::__cxx11::string::~string((string *)&local_f08);
      cmAlphaNum::cmAlphaNum(&local_fb8,(string *)local_e80);
      cmAlphaNum::cmAlphaNum(&local_fe8,"_Info.json");
      cmStrCat<>(&local_f88,&local_fb8,&local_fe8);
      std::__cxx11::string::operator=((string *)&local_dc0->InfoFile,(string *)&local_f88);
      std::__cxx11::string::~string((string *)&local_f88);
      configString = &local_dc0->SettingsFile;
      cmAlphaNum::cmAlphaNum(&local_1048,(string *)local_e80);
      cmAlphaNum::cmAlphaNum(&local_1078,"_Used");
      cmStrCat<>(&local_1018,&local_1048,&local_1078);
      sVar27 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1018);
      local_ff8 = sVar27;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_5,".txt");
      suffix_00._M_str = local_1080;
      suffix_00._M_len = (size_t)__range2_5;
      ConfigFileNames(this,configString,local_ff8,suffix_00);
      std::__cxx11::string::~string((string *)&local_1018);
      std::__cxx11::string::~string((string *)local_e80);
      __gnu_cxx::
      __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
      ::operator++(&__end2_4);
    }
    pvVar15 = &(this->Rcc).Qrcs;
    __end2_5 = std::
               vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
               begin(pvVar15);
    qrc_3 = (Qrc *)std::
                   vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ::end(pvVar15);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_5,
                         (__normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                          *)&qrc_3);
      if (!bVar2) break;
      pQVar17 = __gnu_cxx::
                __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                ::operator*(&__end2_5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&name.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d50);
      std::__cxx11::string::string((string *)local_10e0,(string *)&pQVar17->QrcName);
      local_10e8._M_current = (char *)std::__cxx11::string::begin();
      local_10f0 = (char *)std::__cxx11::string::end();
      local_10f2[1] = 0x2d;
      local_10f2[0] = '_';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_10e8,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_10f0,local_10f2 + 1,local_10f2);
      if ((pQVar17->Unique & 1U) == 0) {
        cmAlphaNum::cmAlphaNum(&local_1148,'_');
        cmAlphaNum::cmAlphaNum
                  ((cmAlphaNum *)
                   &nameOpts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&pQVar17->QrcPathChecksum);
        cmStrCat<>(&local_1118,&local_1148,
                   (cmAlphaNum *)
                   &nameOpts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=((string *)local_10e0,(string *)&local_1118);
        std::__cxx11::string::~string((string *)&local_1118);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2_6);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[6]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2_6,
                 (char (*) [6])0xe2c90f);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2_6,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10e0);
      cmQtAutoGen::RccMergeOptions
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&name.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2_6,
                 (bool)(optionsTarget.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2_6);
      std::__cxx11::string::~string((string *)local_10e0);
      cmQtAutoGen::RccMergeOptions
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&name.field_2 + 8),&pQVar17->Options,
                 (bool)(optionsTarget.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&pQVar17->Options,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&name.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&name.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
      ::operator++(&__end2_5);
    }
    pvVar15 = &(this->Rcc).Qrcs;
    __end2_6 = std::
               vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
               begin(pvVar15);
    qrc_4 = (Qrc *)std::
                   vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ::end(pvVar15);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_6,
                         (__normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                          *)&qrc_4);
      if (!bVar2) break;
      pQVar17 = __gnu_cxx::
                __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                ::operator*(&__end2_6);
      if ((pQVar17->Generated & 1U) == 0) {
        std::__cxx11::string::string
                  ((string *)
                   &lister.ListOptions_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::string
                  ((string *)&local_1228,(string *)&(this->Rcc).super_GenVarsT.Executable);
        peVar18 = std::
                  __shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&(this->Rcc).super_GenVarsT.ExecutableFeatures);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1240,&peVar18->ListOptions);
        cmQtAutoGen::RccLister::RccLister((RccLister *)local_1208,&local_1228,&local_1240);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1240);
        std::__cxx11::string::~string((string *)&local_1228);
        bVar2 = cmQtAutoGen::RccLister::list
                          ((RccLister *)local_1208,&pQVar17->QrcFile,&pQVar17->Resources,
                           (string *)
                           &lister.ListOptions_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
        if (!bVar2) {
          cmSystemTools::Error
                    ((string *)
                     &lister.ListOptions_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          this_local._7_1_ = 0;
        }
        eMuf._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl._5_3_ = 0;
        eMuf._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl._4_1_ = !bVar2;
        cmQtAutoGen::RccLister::~RccLister((RccLister *)local_1208);
        std::__cxx11::string::~string
                  ((string *)
                   &lister.ListOptions_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (eMuf._M_t.
            super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
            .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl._4_4_ != 0)
        goto LAB_008205cc;
      }
      __gnu_cxx::
      __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
      ::operator++(&__end2_6);
    }
    eMuf._M_t.
    super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
    .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl._4_4_ = 0;
LAB_008205cc:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d50);
    if (eMuf._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl._4_4_ != 0)
    goto LAB_008205fa;
  }
  this_local._7_1_ = 1;
LAB_008205fa:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenInitializer::InitScanFiles()
{
  cmake const* cm = this->Makefile->GetCMakeInstance();
  auto const& kw = this->GlobalInitializer->kw();

  auto makeMUFile = [this, &kw](cmSourceFile* sf, std::string const& fullPath,
                                std::vector<size_t> const& configs,
                                bool muIt) -> MUFileHandle {
    MUFileHandle muf = cm::make_unique<MUFile>();
    muf->FullPath = fullPath;
    muf->SF = sf;
    if (!configs.empty() && configs.size() != this->ConfigsList.size()) {
      muf->Configs = configs;
    }
    muf->Generated = sf->GetIsGenerated();
    bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
    muf->SkipMoc = this->Moc.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOMOC));
    muf->SkipUic = this->Uic.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
    if (muIt) {
      muf->MocIt = this->Moc.Enabled && !muf->SkipMoc;
      muf->UicIt = this->Uic.Enabled && !muf->SkipUic;
    }
    return muf;
  };

  auto addMUHeader = [this](MUFileHandle&& muf, cm::string_view extension) {
    cmSourceFile* sf = muf->SF;
    const bool muIt = (muf->MocIt || muf->UicIt);
    if (this->CMP0100Accept || (extension != "hh")) {
      // Accept
      if (muIt && muf->Generated) {
        this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
      }
      this->AutogenTarget.Headers.emplace(sf, std::move(muf));
    } else if (muIt && this->CMP0100Warn) {
      // Store file for warning message
      this->AutogenTarget.CMP0100HeadersWarn.push_back(sf);
    }
  };

  auto addMUSource = [this](MUFileHandle&& muf) {
    if ((muf->MocIt || muf->UicIt) && muf->Generated) {
      this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
    }
    this->AutogenTarget.Sources.emplace(muf->SF, std::move(muf));
  };

  // Scan through target files
  {
    // Scan through target files
    for (cmGeneratorTarget::AllConfigSource const& acs :
         this->GenTarget->GetAllConfigSources()) {
      std::string const& fullPath = acs.Source->GetFullPath();
      std::string const& extLower =
        cmSystemTools::LowerCase(acs.Source->GetExtension());

      // Register files that will be scanned by moc or uic
      if (this->MocOrUicEnabled()) {
        if (cm->IsAHeaderExtension(extLower)) {
          addMUHeader(makeMUFile(acs.Source, fullPath, acs.Configs, true),
                      extLower);
        } else if (cm->IsACLikeSourceExtension(extLower)) {
          addMUSource(makeMUFile(acs.Source, fullPath, acs.Configs, true));
        }
      }

      // Register rcc enabled files
      if (this->Rcc.Enabled) {
        if ((extLower == kw.qrc) &&
            !acs.Source->GetPropertyAsBool(kw.SKIP_AUTOGEN) &&
            !acs.Source->GetPropertyAsBool(kw.SKIP_AUTORCC)) {
          // Register qrc file
          Qrc qrc;
          qrc.QrcFile = fullPath;
          qrc.QrcName =
            cmSystemTools::GetFilenameWithoutLastExtension(qrc.QrcFile);
          qrc.Generated = acs.Source->GetIsGenerated();
          // RCC options
          {
            std::string const& opts =
              acs.Source->GetSafeProperty(kw.AUTORCC_OPTIONS);
            if (!opts.empty()) {
              cmExpandList(opts, qrc.Options);
            }
          }
          this->Rcc.Qrcs.push_back(std::move(qrc));
        }
      }
    }
  }
  // cmGeneratorTarget::GetAllConfigSources computes the target's
  // sources meta data cache. Clear it so that OBJECT library targets that
  // are AUTOGEN initialized after this target get their added
  // mocs_compilation.cpp source acknowledged by this target.
  this->GenTarget->ClearSourcesCache();

  // For source files find additional headers and private headers
  if (this->MocOrUicEnabled()) {
    // Header search suffixes and extensions
    static std::initializer_list<cm::string_view> const suffixes{ "", "_p" };
    auto const& exts = cm->GetHeaderExtensions();
    // Scan through sources
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const& muf = *pair.second;
      if (muf.MocIt || muf.UicIt) {
        // Search for the default header file and a private header
        std::string const& srcFullPath = muf.SF->ResolveFullPath();
        std::string basePath = cmStrCat(
          cmQtAutoGen::SubDirPrefix(srcFullPath),
          cmSystemTools::GetFilenameWithoutLastExtension(srcFullPath));
        for (auto const& suffix : suffixes) {
          std::string const suffixedPath = cmStrCat(basePath, suffix);
          for (auto const& ext : exts) {
            std::string fullPath = cmStrCat(suffixedPath, '.', ext);

            auto constexpr locationKind = cmSourceFileLocationKind::Known;
            cmSourceFile* sf =
              this->Makefile->GetSource(fullPath, locationKind);
            if (sf) {
              // Check if we know about this header already
              if (cm::contains(this->AutogenTarget.Headers, sf)) {
                continue;
              }
              // We only accept not-GENERATED files that do exist.
              if (!sf->GetIsGenerated() &&
                  !cmSystemTools::FileExists(fullPath)) {
                continue;
              }
            } else if (cmSystemTools::FileExists(fullPath)) {
              // Create a new source file for the existing file
              sf = this->Makefile->CreateSource(fullPath, false, locationKind);
            }

            if (sf) {
              auto eMuf = makeMUFile(sf, fullPath, muf.Configs, true);
              // Only process moc/uic when the parent is processed as well
              if (!muf.MocIt) {
                eMuf->MocIt = false;
              }
              if (!muf.UicIt) {
                eMuf->UicIt = false;
              }
              addMUHeader(std::move(eMuf), ext);
            }
          }
        }
      }
    }
  }

  // Scan through all source files in the makefile to extract moc and uic
  // parameters.  Historically we support non target source file parameters.
  // The reason is that their file names might be discovered from source files
  // at generation time.
  if (this->MocOrUicEnabled()) {
    for (const auto& sf : this->Makefile->GetSourceFiles()) {
      // sf->GetExtension() is only valid after sf->ResolveFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->ResolveFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& extLower =
        cmSystemTools::LowerCase(sf->GetExtension());

      if (cm->IsAHeaderExtension(extLower)) {
        if (!cm::contains(this->AutogenTarget.Headers, sf.get())) {
          auto muf = makeMUFile(sf.get(), fullPath, {}, false);
          if (muf->SkipMoc || muf->SkipUic) {
            addMUHeader(std::move(muf), extLower);
          }
        }
      } else if (cm->IsACLikeSourceExtension(extLower)) {
        if (!cm::contains(this->AutogenTarget.Sources, sf.get())) {
          auto muf = makeMUFile(sf.get(), fullPath, {}, false);
          if (muf->SkipMoc || muf->SkipUic) {
            addMUSource(std::move(muf));
          }
        }
      } else if (this->Uic.Enabled && (extLower == kw.ui)) {
        // .ui file
        bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
        bool const skipUic =
          (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
        if (!skipUic) {
          // Check if the .ui file has uic options
          std::string const uicOpts = sf->GetSafeProperty(kw.AUTOUIC_OPTIONS);
          if (uicOpts.empty()) {
            this->Uic.UiFilesNoOptions.emplace_back(fullPath);
          } else {
            this->Uic.UiFilesWithOptions.emplace_back(fullPath,
                                                      cmExpandedList(uicOpts));
          }

          auto uiHeaderRelativePath = cmSystemTools::RelativePath(
            this->LocalGen->GetCurrentSourceDirectory(),
            cmSystemTools::GetFilenamePath(fullPath));

          // Avoid creating a path containing adjacent slashes
          if (!uiHeaderRelativePath.empty() &&
              uiHeaderRelativePath.back() != '/') {
            uiHeaderRelativePath += '/';
          }

          auto uiHeaderFilePath = cmStrCat(
            '/', uiHeaderRelativePath, "ui_"_s,
            cmSystemTools::GetFilenameWithoutLastExtension(fullPath), ".h"_s);

          ConfigString uiHeader;
          std::string uiHeaderGenex;
          this->ConfigFileNamesAndGenex(
            uiHeader, uiHeaderGenex, cmStrCat(this->Dir.Build, "/include"_s),
            uiHeaderFilePath);

          this->Uic.UiHeaders.emplace_back(
            std::make_pair(uiHeader, uiHeaderGenex));
        } else {
          // Register skipped .ui file
          this->Uic.SkipUi.insert(fullPath);
        }
      }
    }
  }

  // Process GENERATED sources and headers
  if (this->MocOrUicEnabled() && !this->AutogenTarget.FilesGenerated.empty()) {
    if (this->CMP0071Accept) {
      // Let the autogen target depend on the GENERATED files
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        this->AutogenTarget.DependFiles.insert(muf->FullPath);
      }
    } else if (this->CMP0071Warn) {
      cm::string_view property;
      if (this->Moc.Enabled && this->Uic.Enabled) {
        property = "SKIP_AUTOGEN";
      } else if (this->Moc.Enabled) {
        property = "SKIP_AUTOMOC";
      } else if (this->Uic.Enabled) {
        property = "SKIP_AUTOUIC";
      }
      std::string files;
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        files += cmStrCat("  ", Quoted(muf->FullPath), '\n');
      }
      this->Makefile->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0071), '\n',
          "For compatibility, CMake is excluding the GENERATED source "
          "file(s):\n",
          files, "from processing by ",
          cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false),
          ".  If any of the files should be processed, set CMP0071 to NEW.  "
          "If any of the files should not be processed, "
          "explicitly exclude them by setting the source file property ",
          property, ":\n  set_property(SOURCE file.h PROPERTY ", property,
          " ON)\n"));
    }
  }

  // Generate CMP0100 warning
  if (this->MocOrUicEnabled() &&
      !this->AutogenTarget.CMP0100HeadersWarn.empty()) {
    cm::string_view property;
    if (this->Moc.Enabled && this->Uic.Enabled) {
      property = "SKIP_AUTOGEN";
    } else if (this->Moc.Enabled) {
      property = "SKIP_AUTOMOC";
    } else if (this->Uic.Enabled) {
      property = "SKIP_AUTOUIC";
    }
    std::string files;
    for (cmSourceFile* sf : this->AutogenTarget.CMP0100HeadersWarn) {
      files += cmStrCat("  ", Quoted(sf->GetFullPath()), '\n');
    }
    this->Makefile->IssueMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat(
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0100), '\n',
        "For compatibility, CMake is excluding the header file(s):\n", files,
        "from processing by ",
        cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false),
        ".  If any of the files should be processed, set CMP0100 to NEW.  "
        "If any of the files should not be processed, "
        "explicitly exclude them by setting the source file property ",
        property, ":\n  set_property(SOURCE file.hh PROPERTY ", property,
        " ON)\n"));
  }

  // Process qrc files
  if (!this->Rcc.Qrcs.empty()) {
    const bool modernQt = (this->QtVersion.Major >= 5);
    // Target rcc options
    std::vector<std::string> optionsTarget =
      cmExpandedList(this->GenTarget->GetSafeProperty(kw.AUTORCC_OPTIONS));

    // Check if file name is unique
    for (Qrc& qrc : this->Rcc.Qrcs) {
      qrc.Unique = true;
      for (Qrc const& qrc2 : this->Rcc.Qrcs) {
        if ((&qrc != &qrc2) && (qrc.QrcName == qrc2.QrcName)) {
          qrc.Unique = false;
          break;
        }
      }
    }
    // Path checksum and file names
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Path checksum
      qrc.QrcPathChecksum = this->PathCheckSum.getPart(qrc.QrcFile);
      // Output file name
      qrc.OutputFile = cmStrCat(this->Dir.Build, '/', qrc.QrcPathChecksum,
                                "/qrc_", qrc.QrcName, ".cpp");
      std::string const base = cmStrCat(this->Dir.Info, "/AutoRcc_",
                                        qrc.QrcName, '_', qrc.QrcPathChecksum);
      qrc.LockFile = cmStrCat(base, "_Lock.lock");
      qrc.InfoFile = cmStrCat(base, "_Info.json");
      this->ConfigFileNames(qrc.SettingsFile, cmStrCat(base, "_Used"), ".txt");
    }
    // rcc options
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Target options
      std::vector<std::string> opts = optionsTarget;
      // Merge computed "-name XYZ" option
      {
        std::string name = qrc.QrcName;
        // Replace '-' with '_'. The former is not valid for symbol names.
        std::replace(name.begin(), name.end(), '-', '_');
        if (!qrc.Unique) {
          name += cmStrCat('_', qrc.QrcPathChecksum);
        }
        std::vector<std::string> nameOpts;
        nameOpts.emplace_back("-name");
        nameOpts.emplace_back(std::move(name));
        RccMergeOptions(opts, nameOpts, modernQt);
      }
      // Merge file option
      RccMergeOptions(opts, qrc.Options, modernQt);
      qrc.Options = std::move(opts);
    }
    // rcc resources
    for (Qrc& qrc : this->Rcc.Qrcs) {
      if (!qrc.Generated) {
        std::string error;
        RccLister const lister(this->Rcc.Executable,
                               this->Rcc.ExecutableFeatures->ListOptions);
        if (!lister.list(qrc.QrcFile, qrc.Resources, error)) {
          cmSystemTools::Error(error);
          return false;
        }
      }
    }
  }

  return true;
}